

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::operator+[abi_cxx11_(StringRef *lhs,StringRef *rhs)

{
  StringRef *in_RDX;
  StringRef *in_RSI;
  string *in_RDI;
  string *str;
  string *rhs_00;
  string *in_stack_ffffffffffffffd0;
  
  rhs_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  StringRef::size(in_RSI);
  StringRef::size(in_RDX);
  std::__cxx11::string::reserve((ulong)rhs_00);
  operator+=(in_stack_ffffffffffffffd0,(StringRef *)rhs_00);
  operator+=(in_stack_ffffffffffffffd0,(StringRef *)rhs_00);
  return in_RDI;
}

Assistant:

auto operator + ( StringRef const& lhs, StringRef const& rhs ) -> std::string {
        std::string str;
        str.reserve( lhs.size() + rhs.size() );
        str += lhs;
        str += rhs;
        return str;
    }